

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

void uv__udp_finish_close(uv_udp_t *handle)

{
  long *plVar1;
  long lVar2;
  undefined8 *puVar3;
  uint __line;
  int iVar4;
  char *__assertion;
  
  iVar4 = uv__io_active(&handle->io_watcher,5);
  if (iVar4 == 0) {
    if ((handle->io_watcher).fd == -1) {
      while (plVar1 = (long *)handle->write_queue[0], handle->write_queue != (void **)plVar1) {
        lVar2 = *plVar1;
        *(long *)plVar1[1] = lVar2;
        *(long *)(lVar2 + 8) = plVar1[1];
        plVar1[0x14] = -0x7d;
        *plVar1 = (long)handle->write_completed_queue;
        puVar3 = (undefined8 *)handle->write_completed_queue[1];
        plVar1[1] = (long)puVar3;
        *puVar3 = plVar1;
        handle->write_completed_queue[1] = plVar1;
      }
      uv__udp_run_completed(handle);
      if (handle->send_queue_size == 0) {
        if (handle->send_queue_count == 0) {
          handle->alloc_cb = (uv_alloc_cb)0x0;
          handle->recv_cb = (uv_udp_recv_cb)0x0;
          return;
        }
        __assertion = "handle->send_queue_count == 0";
        __line = 0x76;
      }
      else {
        __assertion = "handle->send_queue_size == 0";
        __line = 0x75;
      }
    }
    else {
      __assertion = "handle->io_watcher.fd == -1";
      __line = 0x68;
    }
  }
  else {
    __assertion = "!uv__io_active(&handle->io_watcher, POLLIN | POLLOUT)";
    __line = 0x67;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/udp.c"
                ,__line,"void uv__udp_finish_close(uv_udp_t *)");
}

Assistant:

void uv__udp_finish_close(uv_udp_t* handle) {
  uv_udp_send_t* req;
  QUEUE* q;

  assert(!uv__io_active(&handle->io_watcher, POLLIN | POLLOUT));
  assert(handle->io_watcher.fd == -1);

  while (!QUEUE_EMPTY(&handle->write_queue)) {
    q = QUEUE_HEAD(&handle->write_queue);
    QUEUE_REMOVE(q);

    req = QUEUE_DATA(q, uv_udp_send_t, queue);
    req->status = UV_ECANCELED;
    QUEUE_INSERT_TAIL(&handle->write_completed_queue, &req->queue);
  }

  uv__udp_run_completed(handle);

  assert(handle->send_queue_size == 0);
  assert(handle->send_queue_count == 0);

  /* Now tear down the handle. */
  handle->recv_cb = NULL;
  handle->alloc_cb = NULL;
  /* but _do not_ touch close_cb */
}